

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O0

int main(void)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  chck_atlas_texture *t_1;
  int local_90;
  chck_atlas_rect tr_1;
  uint32_t free_1;
  uint32_t h_1;
  uint32_t w_1;
  chck_atlas atlas_1;
  chck_atlas_texture *t;
  int local_48;
  chck_atlas_rect tr;
  uint32_t free;
  uint32_t h;
  uint32_t w;
  chck_atlas atlas;
  
  atlas._28_4_ = 0;
  uVar2 = chck_atlas(&h);
  if ((uVar2 & 1) == 0) {
    __assert_fail("chck_atlas(&atlas)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                  ,0xd,"int main(void)");
  }
  if ((int)atlas.textures != 0) {
    __assert_fail("atlas.count == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                  ,0xe,"int main(void)");
  }
  iVar1 = chck_atlas_push(&h,0x140);
  if (iVar1 == 0) {
    __assert_fail("chck_atlas_push(&atlas, 320, 320)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                  ,0x10,"int main(void)");
  }
  if ((int)atlas.textures != 1) {
    __assert_fail("atlas.count == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                  ,0x11,"int main(void)");
  }
  iVar1 = chck_atlas_pop(&h);
  if (iVar1 != 0) {
    __assert_fail("chck_atlas_pop(&atlas) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                  ,0x13,"int main(void)");
  }
  if ((int)atlas.textures != 0) {
    __assert_fail("atlas.count == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                  ,0x14,"int main(void)");
  }
  iVar1 = chck_atlas_push(&h,0x140);
  if (iVar1 != 1) {
    __assert_fail("chck_atlas_push(&atlas, 320, 320) == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                  ,0x16,"int main(void)");
  }
  iVar1 = chck_atlas_push(&h,0x20);
  if (iVar1 != 2) {
    __assert_fail("chck_atlas_push(&atlas, 32, 32) == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                  ,0x17,"int main(void)");
  }
  iVar1 = chck_atlas_push(&h,0x20,0x120);
  if (iVar1 != 3) {
    __assert_fail("chck_atlas_push(&atlas, 32, 288) == 3",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                  ,0x18,"int main(void)");
  }
  if ((int)atlas.textures != 3) {
    __assert_fail("atlas.count == 3",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                  ,0x19,"int main(void)");
  }
  if ((atlas.textures._4_4_ != 0x140) || (atlas.count != 0x1b800)) {
    __assert_fail("atlas.longest_edge == 320 && atlas.total_area == 320 * 320 + 32 * 32 + 32 * 288",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                  ,0x1a,"int main(void)");
  }
  tr.w = chck_atlas_pack(&h,0,0,&free,&tr.h);
  printf("%ux%u (%u)\n",(ulong)free,(ulong)tr.h,(ulong)tr.w);
  if (((free != 0x160) || (tr.h != 0x140)) || (tr.w != 0x1b800 - atlas.count)) {
    __assert_fail("w == 352 && h == 320 && free == w * h - atlas.total_area",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                  ,0x20,"int main(void)");
  }
  atlas_1._24_8_ = chck_atlas_get(&h,1,(long)&t + 4);
  if (atlas_1._24_8_ == 0) {
    __assert_fail("(t = chck_atlas_get(&atlas, 1, &tr))",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                  ,0x24,"int main(void)");
  }
  if (((t._4_4_ != 0) || (local_48 != 0)) || ((tr.x != 0x140 || (tr.y != 0x140)))) {
    __assert_fail("tr.x == 0 && tr.y == 0 && tr.w == 320 && tr.h == 320",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                  ,0x25,"int main(void)");
  }
  if ((((*(byte *)(atlas_1._24_8_ + 0x18) & 1) != 0) ||
      ((*(byte *)(atlas_1._24_8_ + 0x19) & 1) == 0)) ||
     ((*(int *)(atlas_1._24_8_ + 0x14) != 0x140 || (*(int *)(atlas_1._24_8_ + 0x10) != 0x19000)))) {
    __assert_fail("!t->flipped && t->placed && t->longest_edge == 320 && t->area == 320 * 320",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                  ,0x26,"int main(void)");
  }
  atlas_1._24_8_ = chck_atlas_get(&h,2,(long)&t + 4);
  if (atlas_1._24_8_ == 0) {
    __assert_fail("(t = chck_atlas_get(&atlas, 2, &tr))",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                  ,0x28,"int main(void)");
  }
  if ((((t._4_4_ == 0x140) && (local_48 == 0x120)) && (tr.x == 0x20)) && (tr.y == 0x20)) {
    if ((((*(byte *)(atlas_1._24_8_ + 0x18) & 1) != 0) ||
        ((*(byte *)(atlas_1._24_8_ + 0x19) & 1) == 0)) ||
       ((*(int *)(atlas_1._24_8_ + 0x14) != 0x20 || (*(int *)(atlas_1._24_8_ + 0x10) != 0x400)))) {
      __assert_fail("!t->flipped && t->placed && t->longest_edge == 32 && t->area == 32 * 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                    ,0x2a,"int main(void)");
    }
    atlas_1._24_8_ = chck_atlas_get(&h,3,(long)&t + 4);
    if (atlas_1._24_8_ == 0) {
      __assert_fail("(t = chck_atlas_get(&atlas, 3, &tr))",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                    ,0x2c,"int main(void)");
    }
    if (((t._4_4_ != 0x140) || (local_48 != 0)) || ((tr.x != 0x20 || (tr.y != 0x120)))) {
      __assert_fail("tr.x == 320 && tr.y == 0 && tr.w == 32 && tr.h == 288",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                    ,0x2d,"int main(void)");
    }
    if (((((*(byte *)(atlas_1._24_8_ + 0x18) & 1) != 0) ||
         ((*(byte *)(atlas_1._24_8_ + 0x19) & 1) == 0)) ||
        (*(int *)(atlas_1._24_8_ + 0x14) != 0x120)) || (*(int *)(atlas_1._24_8_ + 0x10) != 0x2400))
    {
      __assert_fail("!t->flipped && t->placed && t->longest_edge == 288 && t->area == 32 * 288",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                    ,0x2e,"int main(void)");
    }
    chck_atlas_release(&h);
    uVar2 = chck_atlas(&h_1);
    if ((uVar2 & 1) == 0) {
      __assert_fail("chck_atlas(&atlas)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                    ,0x36,"int main(void)");
    }
    iVar1 = chck_atlas_push(&h_1,0x140);
    if (iVar1 != 1) {
      __assert_fail("chck_atlas_push(&atlas, 320, 320) == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                    ,0x37,"int main(void)");
    }
    iVar1 = chck_atlas_push(&h_1,0x20);
    if (iVar1 != 2) {
      __assert_fail("chck_atlas_push(&atlas, 32, 32) == 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                    ,0x38,"int main(void)");
    }
    iVar1 = chck_atlas_push(&h_1,0x20,0x120);
    if (iVar1 != 3) {
      __assert_fail("chck_atlas_push(&atlas, 32, 288) == 3",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                    ,0x39,"int main(void)");
    }
    if (((int)atlas_1.textures != 3) || (atlas_1.count != 0x1b800)) {
      __assert_fail("atlas.count == 3 && atlas.total_area == 320 * 320 + 32 * 32 + 32 * 288",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                    ,0x3a,"int main(void)");
    }
    tr_1.w = chck_atlas_pack(&h_1,1,0,&free_1,&tr_1.h);
    printf("%ux%u (%u)\n",(ulong)free_1,(ulong)tr_1.h,(ulong)tr_1.w);
    if (((free_1 != 0x200) || (tr_1.h != 0x200)) || (tr_1.w != 0x40000 - atlas_1.count)) {
      __assert_fail("w == 512 && h == 512 && free == w * h - atlas.total_area",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                    ,0x3f,"int main(void)");
    }
    lVar3 = chck_atlas_get(&h_1,1,(long)&t_1 + 4);
    if (lVar3 == 0) {
      __assert_fail("(t = chck_atlas_get(&atlas, 1, &tr))",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                    ,0x43,"int main(void)");
    }
    if ((((t_1._4_4_ != 0) || (local_90 != 0)) || (tr_1.x != 0x140)) || (tr_1.y != 0x140)) {
      __assert_fail("tr.x == 0 && tr.y == 0 && tr.w == 320 && tr.h == 320",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                    ,0x44,"int main(void)");
    }
    if ((((*(byte *)(lVar3 + 0x18) & 1) != 0) || ((*(byte *)(lVar3 + 0x19) & 1) == 0)) ||
       ((*(int *)(lVar3 + 0x14) != 0x140 || (*(int *)(lVar3 + 0x10) != 0x19000)))) {
      __assert_fail("!t->flipped && t->placed && t->longest_edge == 320 && t->area == 320 * 320",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                    ,0x45,"int main(void)");
    }
    lVar3 = chck_atlas_get(&h_1,2,(long)&t_1 + 4);
    if (lVar3 == 0) {
      __assert_fail("(t = chck_atlas_get(&atlas, 2, &tr))",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                    ,0x47,"int main(void)");
    }
    if (((t_1._4_4_ == 0x140) && (local_90 == 0x120)) && ((tr_1.x == 0x20 && (tr_1.y == 0x20)))) {
      if (((((*(byte *)(lVar3 + 0x18) & 1) != 0) || ((*(byte *)(lVar3 + 0x19) & 1) == 0)) ||
          (*(int *)(lVar3 + 0x14) != 0x20)) || (*(int *)(lVar3 + 0x10) != 0x400)) {
        __assert_fail("!t->flipped && t->placed && t->longest_edge == 32 && t->area == 32 * 32",
                      "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                      ,0x49,"int main(void)");
      }
      lVar3 = chck_atlas_get(&h_1,3,(long)&t_1 + 4);
      if (lVar3 == 0) {
        __assert_fail("(t = chck_atlas_get(&atlas, 3, &tr))",
                      "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                      ,0x4b,"int main(void)");
      }
      if (((t_1._4_4_ == 0x140) && (local_90 == 0)) && ((tr_1.x == 0x20 && (tr_1.y == 0x120)))) {
        if ((((*(byte *)(lVar3 + 0x18) & 1) == 0) && ((*(byte *)(lVar3 + 0x19) & 1) != 0)) &&
           ((*(int *)(lVar3 + 0x14) == 0x120 && (*(int *)(lVar3 + 0x10) == 0x2400)))) {
          chck_atlas_release(&h_1);
          return 0;
        }
        __assert_fail("!t->flipped && t->placed && t->longest_edge == 288 && t->area == 32 * 288",
                      "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                      ,0x4d,"int main(void)");
      }
      __assert_fail("tr.x == 320 && tr.y == 0 && tr.w == 32 && tr.h == 288",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                    ,0x4c,"int main(void)");
    }
    __assert_fail("tr.x == 320 && tr.y == 288 && tr.w == 32 && tr.h == 32",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                  ,0x48,"int main(void)");
  }
  __assert_fail("tr.x == 320 && tr.y == 288 && tr.w == 32 && tr.h == 32",
                "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                ,0x29,"int main(void)");
}

Assistant:

int main(void)
{
   /* TEST: atlas packing */
   {
      struct chck_atlas atlas;
      assert(chck_atlas(&atlas));
      assert(atlas.count == 0);

      assert(chck_atlas_push(&atlas, 320, 320));
      assert(atlas.count == 1);

      assert(chck_atlas_pop(&atlas) == 0);
      assert(atlas.count == 0);

      assert(chck_atlas_push(&atlas, 320, 320) == 1);
      assert(chck_atlas_push(&atlas, 32, 32) == 2);
      assert(chck_atlas_push(&atlas, 32, 288) == 3);
      assert(atlas.count == 3);
      assert(atlas.longest_edge == 320 && atlas.total_area == 320 * 320 + 32 * 32 + 32 * 288);

      uint32_t w, h;
      uint32_t free = chck_atlas_pack(&atlas, false, false, &w, &h);

      printf("%ux%u (%u)\n", w, h, free);
      assert(w == 352 && h == 320 && free == w * h - atlas.total_area);

      struct chck_atlas_rect tr;
      const struct chck_atlas_texture *t;
      assert((t = chck_atlas_get(&atlas, 1, &tr)));
      assert(tr.x == 0 && tr.y == 0 && tr.w == 320 && tr.h == 320);
      assert(!t->flipped && t->placed && t->longest_edge == 320 && t->area == 320 * 320);

      assert((t = chck_atlas_get(&atlas, 2, &tr)));
      assert(tr.x == 320 && tr.y == 288 && tr.w == 32 && tr.h == 32);
      assert(!t->flipped && t->placed && t->longest_edge == 32 && t->area == 32 * 32);

      assert((t = chck_atlas_get(&atlas, 3, &tr)));
      assert(tr.x == 320 && tr.y == 0 && tr.w == 32 && tr.h == 288);
      assert(!t->flipped && t->placed && t->longest_edge == 288 && t->area == 32 * 288);

      chck_atlas_release(&atlas);
   }

   /* TEST: atlas packing (forced pot) */
   {
      struct chck_atlas atlas;
      assert(chck_atlas(&atlas));
      assert(chck_atlas_push(&atlas, 320, 320) == 1);
      assert(chck_atlas_push(&atlas, 32, 32) == 2);
      assert(chck_atlas_push(&atlas, 32, 288) == 3);
      assert(atlas.count == 3 && atlas.total_area == 320 * 320 + 32 * 32 + 32 * 288);

      uint32_t w, h;
      uint32_t free = chck_atlas_pack(&atlas, true, false, &w, &h);
      printf("%ux%u (%u)\n", w, h, free);
      assert(w == 512 && h == 512 && free == w * h - atlas.total_area);

      struct chck_atlas_rect tr;
      const struct chck_atlas_texture *t;
      assert((t = chck_atlas_get(&atlas, 1, &tr)));
      assert(tr.x == 0 && tr.y == 0 && tr.w == 320 && tr.h == 320);
      assert(!t->flipped && t->placed && t->longest_edge == 320 && t->area == 320 * 320);

      assert((t = chck_atlas_get(&atlas, 2, &tr)));
      assert(tr.x == 320 && tr.y == 288 && tr.w == 32 && tr.h == 32);
      assert(!t->flipped && t->placed && t->longest_edge == 32 && t->area == 32 * 32);

      assert((t = chck_atlas_get(&atlas, 3, &tr)));
      assert(tr.x == 320 && tr.y == 0 && tr.w == 32 && tr.h == 288);
      assert(!t->flipped && t->placed && t->longest_edge == 288 && t->area == 32 * 288);

      chck_atlas_release(&atlas);
   }

   return EXIT_SUCCESS;
}